

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Save2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  uint fArea;
  char *pcVar3;
  
  fArea = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"ah"), iVar1 == 0x61) {
    fArea = fArea ^ 1;
  }
  if (iVar1 == -1) {
    pGVar2 = pAbc->pGia;
    if (pGVar2 == (Gia_Man_t *)0x0) {
      pcVar3 = "Empty network.\n";
    }
    else {
      if (pGVar2->vMapping != (Vec_Int_t *)0x0) {
        iVar1 = Gia_ManCompareWithBest
                          (pAbc->pGiaBest2,pGVar2,&pAbc->nBestLuts2,&pAbc->nBestEdges2,
                           &pAbc->nBestLevels2,fArea);
        if (iVar1 == 0) {
          return 0;
        }
        Gia_ManStopP(&pAbc->pGiaBest2);
        pGVar2 = Gia_ManDupWithAttributes(pAbc->pGia);
        pAbc->pGiaBest2 = pGVar2;
        return 0;
      }
      pcVar3 = "GIA has no mapping.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: &save2 [-ah]\n");
    Abc_Print(-2,"\t        compares and possibly saves AIG with mapping\n");
    pcVar3 = "yes";
    if (fArea == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-a    : toggle using area as the primary metric [default = %s]\n",pcVar3);
    pcVar3 = "\t-h    : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Save2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fArea = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fArea ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "GIA has no mapping.\n" );
        return 1;
    }
    if ( !Gia_ManCompareWithBest( pAbc->pGiaBest2, pAbc->pGia, &pAbc->nBestLuts2, &pAbc->nBestEdges2, &pAbc->nBestLevels2, fArea ) )
        return 0;
    // save the design as best
    Gia_ManStopP( &pAbc->pGiaBest2 );
    pAbc->pGiaBest2 = Gia_ManDupWithAttributes( pAbc->pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &save2 [-ah]\n" );
    Abc_Print( -2, "\t        compares and possibly saves AIG with mapping\n" );
    Abc_Print( -2, "\t-a    : toggle using area as the primary metric [default = %s]\n", fArea? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}